

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O1

void __thiscall xray_re::xr_motion_marks::save(xr_motion_marks *this,xr_writer *w)

{
  pointer pmVar1;
  pointer pmVar2;
  undefined1 local_14 [4];
  
  xr_writer::w_s(w,&this->m_name);
  (*w->_vptr_xr_writer[2])(w,local_14,4);
  pmVar1 = (this->super_vector<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>).
           super__Vector_base<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>._M_impl.
           super__Vector_impl_data._M_start;
  pmVar2 = (this->super_vector<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>).
           super__Vector_base<xray_re::motion_mark,_std::allocator<xray_re::motion_mark>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pmVar1 != pmVar2) {
    (*w->_vptr_xr_writer[2])(w,pmVar1,(long)pmVar2 - (long)pmVar1);
  }
  return;
}

Assistant:

void xr_motion_marks::save(xr_writer& w) const
{
	w.w_s(m_name);
	w.w_size_u32(size());
	w.w_seq(*this);
}